

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

ElementMatcherPairs * __thiscall
testing::internal::MaxBipartiteMatchState::Compute
          (ElementMatcherPairs *__return_storage_ptr__,MaxBipartiteMatchState *this)

{
  pointer puVar1;
  unsigned_long uVar2;
  bool bVar3;
  ostream *poVar4;
  size_t ilhs;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> local_58;
  vector<char,_std::allocator<char>_> seen;
  
  seen.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  seen.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  seen.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (uVar5 = 0; uVar5 < *(ulong *)this->graph_; uVar5 = uVar5 + 1) {
    bVar3 = IsTrue((this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5] == 0xffffffffffffffff);
    if (!bVar3) {
      GTestLog::GTestLog((GTestLog *)&local_58,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googlemock/src/gmock-matchers.cc"
                         ,0x94);
      poVar4 = std::operator<<((ostream *)&std::cerr,"Condition left_[ilhs] == kUnused failed. ");
      poVar4 = std::operator<<(poVar4,"ilhs: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", left_[ilhs]: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      GTestLog::~GTestLog((GTestLog *)&local_58);
    }
    local_58.first = local_58.first & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::_M_fill_assign
              (&seen,*(size_type *)(this->graph_ + 8),(value_type *)&local_58);
    TryAugment(this,uVar5,&seen);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar5 = 0;
      puVar1 = (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->left_).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar5 = uVar5 + 1) {
    uVar2 = puVar1[uVar5];
    if (uVar2 != 0xffffffffffffffff) {
      local_58.first = uVar5;
      local_58.second = uVar2;
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)__return_storage_ptr__,&local_58);
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&seen.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

ElementMatcherPairs Compute() {
    // 'seen' is used for path finding { 0: unseen, 1: seen }.
    ::std::vector<char> seen;
    // Searches the residual flow graph for a path from each left node to
    // the sink in the residual flow graph, and if one is found, add flow
    // to the graph. It's okay to search through the left nodes once. The
    // edge from the implicit source node to each previously-visited left
    // node will have flow if that left node has any path to the sink
    // whatsoever. Subsequent augmentations can only add flow to the
    // network, and cannot take away that previous flow unit from the source.
    // Since the source-to-left edge can only carry one flow unit (or,
    // each element can be matched to only one matcher), there is no need
    // to visit the left nodes more than once looking for augmented paths.
    // The flow is known to be possible or impossible by looking at the
    // node once.
    for (size_t ilhs = 0; ilhs < graph_->LhsSize(); ++ilhs) {
      // Reset the path-marking vector and try to find a path from
      // source to sink starting at the left_[ilhs] node.
      GTEST_CHECK_(left_[ilhs] == kUnused)
          << "ilhs: " << ilhs << ", left_[ilhs]: " << left_[ilhs];
      // 'seen' initialized to 'graph_->RhsSize()' copies of 0.
      seen.assign(graph_->RhsSize(), 0);
      TryAugment(ilhs, &seen);
    }
    ElementMatcherPairs result;
    for (size_t ilhs = 0; ilhs < left_.size(); ++ilhs) {
      size_t irhs = left_[ilhs];
      if (irhs == kUnused) continue;
      result.push_back(ElementMatcherPair(ilhs, irhs));
    }
    return result;
  }